

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzP::ArchiveOUT(ChNodeFEAxyzP *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAxyzP>(marchive);
  ChNodeBase::ArchiveOUT
            ((ChNodeBase *)
             ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3]),marchive);
  local_30 = &this->P;
  local_38 = "P";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->P_dt;
  local_38 = "P_dt";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->F;
  local_38 = "F";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChNodeFEAxyzP::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzP>();
    // serialize parent class
    ChNodeFEAbase::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(P);
    marchive << CHNVP(P_dt);
    marchive << CHNVP(F);
}